

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,phmap::priv::HashEq<cs::statement_base*,void>::Hash,phmap::priv::HashEq<cs::statement_base*,void>::Eq,std::allocator<cs::statement_base*>>
::find_impl<cs::statement_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::statement_base*>,phmap::priv::HashEq<cs::statement_base*,void>::Hash,phmap::priv::HashEq<cs::statement_base*,void>::Eq,std::allocator<cs::statement_base*>>
           *this,key_arg<cs::statement_base_*> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  key_arg<cs::statement_base_*> psVar5;
  key_arg<cs::statement_base_*> psVar6;
  uint uVar7;
  ushort uVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  ulong uVar27;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  bool bVar32;
  __m128i match;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar36 [16];
  byte bVar26;
  char cVar35;
  char cVar37;
  char cVar38;
  char cVar39;
  
  uVar2 = *(ulong *)(this + 0x18);
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar30 = hashval >> 7 & uVar2;
  lVar3 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  bVar26 = (byte)hashval;
  bVar25 = bVar26 & 0x7f;
  auVar33 = ZEXT216(CONCAT11(bVar26,bVar26) & 0x7f7f);
  auVar33 = pshuflw(auVar33,auVar33,0);
  psVar5 = *key;
  lVar29 = 0;
  do {
    pcVar1 = (char *)(lVar3 + uVar30);
    cVar9 = *pcVar1;
    cVar10 = pcVar1[1];
    cVar11 = pcVar1[2];
    cVar12 = pcVar1[3];
    cVar13 = pcVar1[4];
    cVar14 = pcVar1[5];
    cVar15 = pcVar1[6];
    cVar16 = pcVar1[7];
    cVar17 = pcVar1[8];
    cVar18 = pcVar1[9];
    cVar19 = pcVar1[10];
    cVar20 = pcVar1[0xb];
    cVar21 = pcVar1[0xc];
    cVar22 = pcVar1[0xd];
    cVar23 = pcVar1[0xe];
    cVar24 = pcVar1[0xf];
    cVar35 = auVar33[0];
    auVar36[0] = -(cVar35 == cVar9);
    cVar37 = auVar33[1];
    auVar36[1] = -(cVar37 == cVar10);
    cVar38 = auVar33[2];
    auVar36[2] = -(cVar38 == cVar11);
    cVar39 = auVar33[3];
    auVar36[3] = -(cVar39 == cVar12);
    auVar36[4] = -(cVar35 == cVar13);
    auVar36[5] = -(cVar37 == cVar14);
    auVar36[6] = -(cVar38 == cVar15);
    auVar36[7] = -(cVar39 == cVar16);
    auVar36[8] = -(cVar35 == cVar17);
    auVar36[9] = -(cVar37 == cVar18);
    auVar36[10] = -(cVar38 == cVar19);
    auVar36[0xb] = -(cVar39 == cVar20);
    auVar36[0xc] = -(cVar35 == cVar21);
    auVar36[0xd] = -(cVar37 == cVar22);
    auVar36[0xe] = -(cVar38 == cVar23);
    auVar36[0xf] = -(cVar39 == cVar24);
    uVar8 = (ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe | (ushort)(auVar36[0xf] >> 7) << 0xf;
    bVar32 = uVar8 == 0;
    if (!bVar32) {
      uVar28 = (uint)uVar8;
      do {
        uVar7 = 0;
        if (uVar28 != 0) {
          for (; (uVar28 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
          }
        }
        uVar27 = uVar7 + uVar30 & uVar2;
        psVar6 = *(key_arg<cs::statement_base_*> *)(lVar4 + uVar27 * 8);
        bVar25 = bVar25 | psVar6 == psVar5;
        if (psVar6 == psVar5) break;
        uVar28 = uVar28 - 1 & uVar28;
        bVar32 = uVar28 == 0;
      } while (!bVar32);
      *offset = uVar27;
    }
    if (bVar32) {
      auVar34[0] = -(cVar9 == -0x80);
      auVar34[1] = -(cVar10 == -0x80);
      auVar34[2] = -(cVar11 == -0x80);
      auVar34[3] = -(cVar12 == -0x80);
      auVar34[4] = -(cVar13 == -0x80);
      auVar34[5] = -(cVar14 == -0x80);
      auVar34[6] = -(cVar15 == -0x80);
      auVar34[7] = -(cVar16 == -0x80);
      auVar34[8] = -(cVar17 == -0x80);
      auVar34[9] = -(cVar18 == -0x80);
      auVar34[10] = -(cVar19 == -0x80);
      auVar34[0xb] = -(cVar20 == -0x80);
      auVar34[0xc] = -(cVar21 == -0x80);
      auVar34[0xd] = -(cVar22 == -0x80);
      auVar34[0xe] = -(cVar23 == -0x80);
      auVar34[0xf] = -(cVar24 == -0x80);
      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar34 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar34 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar34 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar34 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar34 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar34 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar34 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar34 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar34 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar34 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar34 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar34 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar34[0xf])
      {
        lVar31 = uVar30 + lVar29;
        lVar29 = lVar29 + 0x10;
        uVar30 = lVar31 + 0x10U & uVar2;
        bVar32 = true;
      }
      else {
        bVar32 = false;
        bVar25 = 0;
      }
    }
    else {
      bVar32 = false;
    }
    if (!bVar32) {
      return (bool)(bVar25 & 1);
    }
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const
			{
				return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
			}